

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzer.cpp
# Opt level: O0

void __thiscall
HdlcAnalyzer::ProcessInformationField
          (HdlcAnalyzer *this,vector<HdlcByte,_std::allocator<HdlcByte>_> *information)

{
  ulong uVar1;
  size_type sVar2;
  const_reference pvVar3;
  undefined1 local_68 [8];
  Frame frame;
  U8 flag;
  HdlcByte byte;
  U32 i;
  vector<HdlcByte,_std::allocator<HdlcByte>_> *information_local;
  HdlcAnalyzer *this_local;
  
  byte._20_4_ = 0;
  while( true ) {
    sVar2 = std::vector<HdlcByte,_std::allocator<HdlcByte>_>::size(information);
    if (sVar2 <= (uint)byte._20_4_) break;
    pvVar3 = std::vector<HdlcByte,_std::allocator<HdlcByte>_>::at
                       (information,(ulong)(uint)byte._20_4_);
    uVar1._0_1_ = pvVar3->value;
    uVar1._1_1_ = pvVar3->escaped;
    uVar1._2_6_ = *(undefined6 *)&pvVar3->field_0x12;
    CreateFrame((HdlcAnalyzer *)local_68,(U8)this,5,pvVar3->startSample,pvVar3->endSample,
                uVar1 & 0xff,byte._20_1_);
    AddFrameToResults(this,(Frame *)local_68);
    Frame::~Frame((Frame *)local_68);
    byte._20_4_ = byte._20_4_ + 1;
  }
  return;
}

Assistant:

void HdlcAnalyzer::ProcessInformationField( const vector<HdlcByte>& information )
{
    for( U32 i = 0; i < information.size(); ++i )
    {
        HdlcByte byte = information.at( i );
        U8 flag = ( byte.escaped ) ? HDLC_ESCAPED_BYTE : 0;
        Frame frame = CreateFrame( HDLC_FIELD_INFORMATION, byte.startSample, byte.endSample, byte.value, i, flag );
        AddFrameToResults( frame );
    }
}